

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O0

Hop_Obj_t * Hop_ObjRecognizeMux(Hop_Obj_t *pNode,Hop_Obj_t **ppNodeT,Hop_Obj_t **ppNodeE)

{
  int iVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *pHVar5;
  Hop_Obj_t *pHVar6;
  Hop_Obj_t *pNode1;
  Hop_Obj_t *pNode0;
  Hop_Obj_t **ppNodeE_local;
  Hop_Obj_t **ppNodeT_local;
  Hop_Obj_t *pNode_local;
  
  iVar1 = Hop_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopUtil.c"
                  ,0xea,"Hop_Obj_t *Hop_ObjRecognizeMux(Hop_Obj_t *, Hop_Obj_t **, Hop_Obj_t **)");
  }
  iVar1 = Hop_ObjIsMuxType(pNode);
  if (iVar1 != 0) {
    pHVar3 = Hop_ObjFanin0(pNode);
    pHVar4 = Hop_ObjFanin1(pNode);
    pHVar5 = Hop_ObjFanin1(pHVar3);
    pHVar6 = Hop_ObjFanin1(pHVar4);
    if (pHVar5 == pHVar6) {
      iVar1 = Hop_ObjFaninC1(pHVar3);
      iVar2 = Hop_ObjFaninC1(pHVar4);
      if (iVar1 != iVar2) {
        iVar1 = Hop_ObjFaninC1(pHVar3);
        if (iVar1 != 0) {
          pHVar5 = Hop_ObjChild0(pHVar4);
          pHVar5 = Hop_Not(pHVar5);
          *ppNodeT = pHVar5;
          pHVar3 = Hop_ObjChild0(pHVar3);
          pHVar3 = Hop_Not(pHVar3);
          *ppNodeE = pHVar3;
          pHVar3 = Hop_ObjChild1(pHVar4);
          return pHVar3;
        }
        pHVar5 = Hop_ObjChild0(pHVar3);
        pHVar5 = Hop_Not(pHVar5);
        *ppNodeT = pHVar5;
        pHVar4 = Hop_ObjChild0(pHVar4);
        pHVar4 = Hop_Not(pHVar4);
        *ppNodeE = pHVar4;
        pHVar3 = Hop_ObjChild1(pHVar3);
        return pHVar3;
      }
    }
    pHVar5 = Hop_ObjFanin0(pHVar3);
    pHVar6 = Hop_ObjFanin0(pHVar4);
    if (pHVar5 == pHVar6) {
      iVar1 = Hop_ObjFaninC0(pHVar3);
      iVar2 = Hop_ObjFaninC0(pHVar4);
      if (iVar1 != iVar2) {
        iVar1 = Hop_ObjFaninC0(pHVar3);
        if (iVar1 != 0) {
          pHVar5 = Hop_ObjChild1(pHVar4);
          pHVar5 = Hop_Not(pHVar5);
          *ppNodeT = pHVar5;
          pHVar3 = Hop_ObjChild1(pHVar3);
          pHVar3 = Hop_Not(pHVar3);
          *ppNodeE = pHVar3;
          pHVar3 = Hop_ObjChild0(pHVar4);
          return pHVar3;
        }
        pHVar5 = Hop_ObjChild1(pHVar3);
        pHVar5 = Hop_Not(pHVar5);
        *ppNodeT = pHVar5;
        pHVar4 = Hop_ObjChild1(pHVar4);
        pHVar4 = Hop_Not(pHVar4);
        *ppNodeE = pHVar4;
        pHVar3 = Hop_ObjChild0(pHVar3);
        return pHVar3;
      }
    }
    pHVar5 = Hop_ObjFanin0(pHVar3);
    pHVar6 = Hop_ObjFanin1(pHVar4);
    if (pHVar5 == pHVar6) {
      iVar1 = Hop_ObjFaninC0(pHVar3);
      iVar2 = Hop_ObjFaninC1(pHVar4);
      if (iVar1 != iVar2) {
        iVar1 = Hop_ObjFaninC0(pHVar3);
        if (iVar1 != 0) {
          pHVar5 = Hop_ObjChild0(pHVar4);
          pHVar5 = Hop_Not(pHVar5);
          *ppNodeT = pHVar5;
          pHVar3 = Hop_ObjChild1(pHVar3);
          pHVar3 = Hop_Not(pHVar3);
          *ppNodeE = pHVar3;
          pHVar3 = Hop_ObjChild1(pHVar4);
          return pHVar3;
        }
        pHVar5 = Hop_ObjChild1(pHVar3);
        pHVar5 = Hop_Not(pHVar5);
        *ppNodeT = pHVar5;
        pHVar4 = Hop_ObjChild0(pHVar4);
        pHVar4 = Hop_Not(pHVar4);
        *ppNodeE = pHVar4;
        pHVar3 = Hop_ObjChild0(pHVar3);
        return pHVar3;
      }
    }
    pHVar5 = Hop_ObjFanin1(pHVar3);
    pHVar6 = Hop_ObjFanin0(pHVar4);
    if (pHVar5 == pHVar6) {
      iVar1 = Hop_ObjFaninC1(pHVar3);
      iVar2 = Hop_ObjFaninC0(pHVar4);
      if (iVar1 != iVar2) {
        iVar1 = Hop_ObjFaninC1(pHVar3);
        if (iVar1 == 0) {
          pHVar5 = Hop_ObjChild0(pHVar3);
          pHVar5 = Hop_Not(pHVar5);
          *ppNodeT = pHVar5;
          pHVar4 = Hop_ObjChild1(pHVar4);
          pHVar4 = Hop_Not(pHVar4);
          *ppNodeE = pHVar4;
          pNode_local = Hop_ObjChild1(pHVar3);
        }
        else {
          pHVar5 = Hop_ObjChild1(pHVar4);
          pHVar5 = Hop_Not(pHVar5);
          *ppNodeT = pHVar5;
          pHVar3 = Hop_ObjChild0(pHVar3);
          pHVar3 = Hop_Not(pHVar3);
          *ppNodeE = pHVar3;
          pNode_local = Hop_ObjChild0(pHVar4);
        }
        return pNode_local;
      }
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopUtil.c"
                  ,0x131,"Hop_Obj_t *Hop_ObjRecognizeMux(Hop_Obj_t *, Hop_Obj_t **, Hop_Obj_t **)");
  }
  __assert_fail("Hop_ObjIsMuxType(pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopUtil.c"
                ,0xeb,"Hop_Obj_t *Hop_ObjRecognizeMux(Hop_Obj_t *, Hop_Obj_t **, Hop_Obj_t **)");
}

Assistant:

Hop_Obj_t * Hop_ObjRecognizeMux( Hop_Obj_t * pNode, Hop_Obj_t ** ppNodeT, Hop_Obj_t ** ppNodeE )
{
    Hop_Obj_t * pNode0, * pNode1;
    assert( !Hop_IsComplement(pNode) );
    assert( Hop_ObjIsMuxType(pNode) );
    // get children
    pNode0 = Hop_ObjFanin0(pNode);
    pNode1 = Hop_ObjFanin1(pNode);

    // find the control variable
    if ( Hop_ObjFanin1(pNode0) == Hop_ObjFanin1(pNode1) && (Hop_ObjFaninC1(pNode0) ^ Hop_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Hop_ObjFaninC1(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Hop_Not(Hop_ObjChild0(pNode0));//pNode1->p1);
            return Hop_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Hop_Not(Hop_ObjChild0(pNode1));//pNode2->p1);
            return Hop_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    else if ( Hop_ObjFanin0(pNode0) == Hop_ObjFanin0(pNode1) && (Hop_ObjFaninC0(pNode0) ^ Hop_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Hop_ObjFaninC0(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Hop_Not(Hop_ObjChild1(pNode0));//pNode1->p2);
            return Hop_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Hop_Not(Hop_ObjChild1(pNode1));//pNode2->p2);
            return Hop_ObjChild0(pNode0);//pNode1->p1;
        }
    }
    else if ( Hop_ObjFanin0(pNode0) == Hop_ObjFanin1(pNode1) && (Hop_ObjFaninC0(pNode0) ^ Hop_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Hop_ObjFaninC0(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Hop_Not(Hop_ObjChild1(pNode0));//pNode1->p2);
            return Hop_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Hop_Not(Hop_ObjChild0(pNode1));//pNode2->p1);
            return Hop_ObjChild0(pNode0);//pNode1->p1;
        }
    }
    else if ( Hop_ObjFanin1(pNode0) == Hop_ObjFanin0(pNode1) && (Hop_ObjFaninC1(pNode0) ^ Hop_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Hop_ObjFaninC1(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Hop_Not(Hop_ObjChild0(pNode0));//pNode1->p1);
            return Hop_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Hop_Not(Hop_ObjChild1(pNode1));//pNode2->p2);
            return Hop_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}